

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O1

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long *plVar5;
  double *pdVar6;
  double *pdVar7;
  sunrealtype *rdata;
  double dVar8;
  
  pdVar4 = *(double **)((long)y->content + 0x10);
  dVar1 = *pdVar4;
  dVar2 = pdVar4[2];
  dVar8 = (dVar1 + dVar1) * pdVar4[1];
  plVar5 = *(long **)((long)J->content + 0x20);
  pdVar4 = (double *)*plVar5;
  dVar3 = *(double *)((long)user_data + 0x10);
  *pdVar4 = dVar8 - (dVar2 + 1.0);
  pdVar6 = (double *)plVar5[1];
  *pdVar6 = dVar1 * dVar1;
  pdVar7 = (double *)plVar5[2];
  *pdVar7 = -dVar1;
  pdVar4[1] = dVar2 - dVar8;
  pdVar6[1] = -dVar1 * dVar1;
  pdVar7[1] = dVar1;
  pdVar4[2] = -dVar2;
  pdVar6[2] = 0.0;
  pdVar7[2] = -1.0 / dVar3 - dVar1;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype ep = rdata[2];                    /* access data entries */
  sunrealtype u  = NV_Ith_S(y, 0);              /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);
  sunrealtype w  = NV_Ith_S(y, 2);

  /* fill in the Jacobian via SUNDenseMatrix macro, SM_ELEMENT_D (see sunmatrix_dense.h) */
  SM_ELEMENT_D(J, 0, 0) = -(w + 1.0) + 2.0 * u * v;
  SM_ELEMENT_D(J, 0, 1) = u * u;
  SM_ELEMENT_D(J, 0, 2) = -u;

  SM_ELEMENT_D(J, 1, 0) = w - 2.0 * u * v;
  SM_ELEMENT_D(J, 1, 1) = -u * u;
  SM_ELEMENT_D(J, 1, 2) = u;

  SM_ELEMENT_D(J, 2, 0) = -w;
  SM_ELEMENT_D(J, 2, 1) = 0.0;
  SM_ELEMENT_D(J, 2, 2) = -1.0 / ep - u;

  return 0; /* Return with success */
}